

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O1

FT_Error tt_face_load_gasp(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  undefined8 uVar1;
  undefined8 uVar2;
  FT_UInt16 FVar3;
  FT_UInt16 FVar4;
  FT_Error FVar5;
  undefined8 in_RAX;
  TT_GaspRange P;
  ulong uVar6;
  bool bVar7;
  FT_Error error;
  FT_Error local_38;
  undefined4 uStack_34;
  
  uStack_34 = (undefined4)((ulong)in_RAX >> 0x20);
  memory = stream->memory;
  P = (TT_GaspRange)0x0;
  FVar5 = (*face->goto_table)(face,0x67617370,stream,(FT_ULong *)0x0);
  _local_38 = CONCAT44(uStack_34,FVar5);
  if (FVar5 != 0) goto LAB_002490b2;
  FVar5 = FT_Stream_EnterFrame(stream,4);
  _local_38 = CONCAT44(uStack_34,FVar5);
  if (FVar5 == 0) {
    FVar3 = FT_Stream_GetUShort(stream);
    (face->gasp).version = FVar3;
    FVar3 = FT_Stream_GetUShort(stream);
    FT_Stream_ExitFrame(stream);
    if ((face->gasp).version < 2) {
      _local_38 = CONCAT26(FVar3,_local_38);
      P = (TT_GaspRange)ft_mem_qrealloc(memory,4,0,(ulong)FVar3,(void *)0x0,&local_38);
      if (local_38 != 0) goto LAB_002490b2;
      FVar5 = FT_Stream_EnterFrame(stream,(ulong)((uint)FVar3 * 4));
      uVar1 = _local_38;
      _local_38 = CONCAT44(uStack_34,FVar5);
      uVar2 = _local_38;
      if (FVar5 != 0) goto LAB_002490b2;
      uStack_34._2_2_ = SUB82(uVar1,6);
      bVar7 = uStack_34._2_2_ != 0;
      _local_38 = uVar2;
      if (bVar7) {
        uVar6 = 0;
        do {
          FVar4 = FT_Stream_GetUShort(stream);
          P[uVar6].maxPPEM = FVar4;
          FVar4 = FT_Stream_GetUShort(stream);
          P[uVar6].gaspFlag = FVar4;
          uVar6 = uVar6 + 1;
        } while (FVar3 != uVar6);
      }
      (face->gasp).gaspRanges = P;
      (face->gasp).numRanges = uStack_34._2_2_;
      FT_Stream_ExitFrame(stream);
    }
    else {
      (face->gasp).numRanges = 0;
      _local_38 = CONCAT44(uStack_34,8);
    }
  }
  P = (TT_GaspRange)0x0;
LAB_002490b2:
  ft_mem_free(memory,P);
  return local_38;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_gasp( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;

    FT_UShort      j, num_ranges;
    TT_GaspRange   gasp_ranges = NULL;


    /* the gasp table is optional */
    error = face->goto_table( face, TTAG_gasp, stream, 0 );
    if ( error )
      goto Exit;

    if ( FT_FRAME_ENTER( 4L ) )
      goto Exit;

    face->gasp.version = FT_GET_USHORT();
    num_ranges         = FT_GET_USHORT();

    FT_FRAME_EXIT();

    /* only support versions 0 and 1 of the table */
    if ( face->gasp.version >= 2 )
    {
      face->gasp.numRanges = 0;
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    FT_TRACE3(( "numRanges: %hu\n", num_ranges ));

    if ( FT_QNEW_ARRAY( gasp_ranges, num_ranges ) ||
         FT_FRAME_ENTER( num_ranges * 4L )        )
      goto Exit;

    for ( j = 0; j < num_ranges; j++ )
    {
      gasp_ranges[j].maxPPEM  = FT_GET_USHORT();
      gasp_ranges[j].gaspFlag = FT_GET_USHORT();

      FT_TRACE3(( "gaspRange %hu: rangeMaxPPEM %5hu, rangeGaspBehavior 0x%hx\n",
                  j,
                  gasp_ranges[j].maxPPEM,
                  gasp_ranges[j].gaspFlag ));
    }

    face->gasp.gaspRanges = gasp_ranges;
    gasp_ranges           = NULL;
    face->gasp.numRanges  = num_ranges;

    FT_FRAME_EXIT();

  Exit:
    FT_FREE( gasp_ranges );
    return error;
  }